

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_10uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  
  pbVar7 = pSrc + 4;
  for (uVar5 = 0; uVar5 < (length & 0xfffffffffffffffc); uVar5 = uVar5 + 4) {
    bVar1 = pbVar7[-3];
    bVar2 = pbVar7[-2];
    bVar3 = pbVar7[-1];
    bVar4 = *pbVar7;
    pDst[uVar5] = (uint)(bVar1 >> 6) + (uint)pbVar7[-4] * 4;
    pDst[uVar5 + 1] = (uint)(bVar2 >> 4) | (bVar1 & 0x3f) << 4;
    pDst[uVar5 + 2] = (uint)(bVar3 >> 2) | (bVar2 & 0xf) << 6;
    pDst[uVar5 + 3] = (bVar3 & 3) << 8 | (uint)bVar4;
    pbVar7 = pbVar7 + 5;
  }
  if ((length & 3) != 0) {
    bVar1 = pbVar7[-3];
    pDst[uVar5] = (uint)(bVar1 >> 6) + (uint)pbVar7[-4] * 4;
    iVar6 = (int)(length & 3);
    if (iVar6 != 1) {
      bVar2 = pbVar7[-2];
      pDst[uVar5 + 1] = (uint)(bVar2 >> 4) | (bVar1 & 0x3f) << 4;
      if (iVar6 == 3) {
        pDst[uVar5 + 2] = (uint)(pbVar7[-1] >> 2) | (bVar2 & 0xf) << 6;
      }
    }
  }
  return;
}

Assistant:

static void tif_10uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
		pDst[i+2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
		pDst[i+3] = (OPJ_INT32)(((val3 & 0x3U) << 8) | val4);
		
	}
	if (length & 3U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		length = length & 3U;
		pDst[i+0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));
		
		if (length > 1U) {
			OPJ_UINT32 val2 = *pSrc++;
			pDst[i+1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
			if (length > 2U) {
				OPJ_UINT32 val3 = *pSrc++;
				pDst[i+2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
			}
		}
	}
}